

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O3

void __thiscall Catch::Runner::Runner(Runner *this,Ptr<Catch::Config> *config)

{
  _Rb_tree_header *p_Var1;
  Config *pCVar2;
  
  pCVar2 = config->m_p;
  (this->m_config).m_p = pCVar2;
  if (pCVar2 != (Config *)0x0) {
    (*(pCVar2->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
      _vptr_NonCopyable[2])();
  }
  std::ofstream::ofstream(&this->m_ofs);
  (this->m_reporter).m_p = (IStreamingReporter *)0x0;
  p_Var1 = &(this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header;
  (this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  openStream(this);
  makeReporter(this);
  return;
}

Assistant:

Runner( Ptr<Config> const& config )
        :   m_config( config )
        {
            openStream();
            makeReporter();
        }